

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void renameParentFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  sqlite3 *db;
  int iVar1;
  uchar *z;
  uchar *puVar2;
  char *pcVar3;
  char *pcVar4;
  u64 n;
  char *p;
  int token;
  uchar *local_58;
  char *local_50;
  uchar *local_48;
  uchar *local_40;
  sqlite3_context *local_38;
  
  db = context->pOut->db;
  z = sqlite3_value_text(*argv);
  puVar2 = sqlite3_value_text(argv[1]);
  local_48 = sqlite3_value_text(argv[2]);
  if (puVar2 == (uchar *)0x0 || z == (uchar *)0x0) {
    return;
  }
  p = (char *)0x0;
  local_58 = z;
  local_40 = puVar2;
  local_38 = context;
  for (; *z != '\0'; z = z + n) {
    iVar1 = sqlite3GetToken(z,&token);
    if (token == 0x69) {
      do {
        z = z + iVar1;
        iVar1 = sqlite3GetToken(z,&token);
      } while (token == 0xa3);
      if (token == 0xa4) break;
      n = (u64)iVar1;
      pcVar3 = sqlite3DbStrNDup(db,(char *)z,n);
      if (pcVar3 == (char *)0x0) break;
      sqlite3Dequote(pcVar3);
      iVar1 = sqlite3StrICmp((char *)local_40,pcVar3);
      if (iVar1 == 0) {
        pcVar4 = p;
        if (p == (char *)0x0) {
          pcVar4 = "";
        }
        local_50 = sqlite3MPrintf(db,"%s%.*s\"%w\"",pcVar4,(ulong)(uint)((int)z - (int)local_58),
                                  local_58,local_48);
        sqlite3DbFree(db,p);
        local_58 = z + n;
        p = local_50;
      }
      sqlite3DbFreeNN(db,pcVar3);
    }
    else {
      n = (u64)iVar1;
    }
  }
  pcVar3 = "";
  if (p != (char *)0x0) {
    pcVar3 = p;
  }
  pcVar3 = sqlite3MPrintf(db,"%s%s",pcVar3,local_58);
  sqlite3_result_text(local_38,pcVar3,-1,sqlite3MallocSize);
  sqlite3DbFree(db,p);
  return;
}

Assistant:

static void renameParentFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  sqlite3 *db = sqlite3_context_db_handle(context);
  char *zOutput = 0;
  char *zResult;
  unsigned char const *zInput = sqlite3_value_text(argv[0]);
  unsigned char const *zOld = sqlite3_value_text(argv[1]);
  unsigned char const *zNew = sqlite3_value_text(argv[2]);

  unsigned const char *z;         /* Pointer to token */
  int n;                          /* Length of token z */
  int token;                      /* Type of token */

  UNUSED_PARAMETER(NotUsed);
  if( zInput==0 || zOld==0 ) return;
  for(z=zInput; *z; z=z+n){
    n = sqlite3GetToken(z, &token);
    if( token==TK_REFERENCES ){
      char *zParent;
      do {
        z += n;
        n = sqlite3GetToken(z, &token);
      }while( token==TK_SPACE );

      if( token==TK_ILLEGAL ) break;
      zParent = sqlite3DbStrNDup(db, (const char *)z, n);
      if( zParent==0 ) break;
      sqlite3Dequote(zParent);
      if( 0==sqlite3StrICmp((const char *)zOld, zParent) ){
        char *zOut = sqlite3MPrintf(db, "%s%.*s\"%w\"", 
            (zOutput?zOutput:""), (int)(z-zInput), zInput, (const char *)zNew
        );
        sqlite3DbFree(db, zOutput);
        zOutput = zOut;
        zInput = &z[n];
      }
      sqlite3DbFree(db, zParent);
    }
  }

  zResult = sqlite3MPrintf(db, "%s%s", (zOutput?zOutput:""), zInput), 
  sqlite3_result_text(context, zResult, -1, SQLITE_DYNAMIC);
  sqlite3DbFree(db, zOutput);
}